

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O0

RecoveryTest * __thiscall leveldb::RecoveryTest::ManifestFileName_abi_cxx11_(RecoveryTest *this)

{
  Env *env;
  char *pcVar1;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238 [32];
  long local_218;
  size_t len;
  Status local_1f0 [3];
  Tester local_1d8;
  string local_38 [8];
  string current;
  RecoveryTest *this_local;
  
  std::__cxx11::string::string(local_38);
  test::Tester::Tester
            (&local_1d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0x57);
  env = *(Env **)(in_RSI + 0x20);
  CurrentFileName((leveldb *)&len,in_RSI);
  ReadFileToString((leveldb *)local_1f0,env,(string *)&len,(string *)local_38);
  test::Tester::IsOk(&local_1d8,local_1f0);
  Status::~Status(local_1f0);
  std::__cxx11::string::~string((string *)&len);
  test::Tester::~Tester(&local_1d8);
  local_218 = std::__cxx11::string::size();
  if (local_218 != 0) {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    if (*pcVar1 == '\n') {
      std::__cxx11::string::resize((ulong)local_38);
    }
  }
  std::operator+(local_238,(char *)in_RSI);
  std::operator+(&this->dbname_,local_238);
  std::__cxx11::string::~string((string *)local_238);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

std::string ManifestFileName() {
    std::string current;
    ASSERT_OK(ReadFileToString(env_, CurrentFileName(dbname_), &current));
    size_t len = current.size();
    if (len > 0 && current[len - 1] == '\n') {
      current.resize(len - 1);
    }
    return dbname_ + "/" + current;
  }